

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorPoolDatabaseTest_PreserveSourceCodeInfo_Test::TestBody
          (DescriptorPoolDatabaseTest_PreserveSourceCodeInfo_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffb90;
  AssertHelper local_400;
  Message local_3f8;
  protobuf local_3f0 [8];
  char local_3e8 [8];
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_3b0;
  Message local_3a8;
  allocator<char> local_399;
  string local_398;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__2;
  Message local_358;
  protobuf local_350 [8];
  char local_348 [8];
  undefined1 local_340 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_310;
  Message local_308;
  allocator<char> local_2f9;
  string local_2f8;
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__1;
  Message local_2b8;
  protobuf local_2b0 [8];
  char local_2a8 [8];
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar;
  string local_288;
  AssertHelper local_268;
  Message local_260;
  allocator<char> local_251;
  string local_250;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_;
  FileDescriptorProto file;
  undefined1 local_118 [8];
  DescriptorPoolDatabase db;
  DescriptorPool pool;
  undefined1 local_78 [8];
  SimpleDescriptorDatabase original_db;
  DescriptorPoolDatabaseTest_PreserveSourceCodeInfo_Test *this_local;
  
  original_db.files_to_delete_.
  super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  SimpleDescriptorDatabase::SimpleDescriptorDatabase((SimpleDescriptorDatabase *)local_78);
  AddToDatabase((SimpleDescriptorDatabase *)local_78,
                "\n    name: \"foo.proto\"\n    package: \"foo\"\n    message_type {\n      name: \"Foo\"\n      extension_range { start: 1 end: 100 }\n    }\n    extension {\n      name: \"foo_ext\"\n      extendee: \".foo.Foo\"\n      number: 3\n      label: LABEL_OPTIONAL\n      type: TYPE_INT32\n    }\n    source_code_info { location { leading_detached_comments: \"comment\" } }\n  "
               );
  DescriptorPool::DescriptorPool
            ((DescriptorPool *)&db.options_,(DescriptorDatabase *)local_78,(ErrorCollector *)0x0);
  DescriptorPoolDatabase::DescriptorPoolDatabase
            ((DescriptorPoolDatabase *)local_118,(DescriptorPool *)&db.options_,
             (DescriptorPoolDatabaseOptions)0x1);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"foo.proto",&local_251);
  local_229 = DescriptorPoolDatabase::FindFileByName
                        ((DescriptorPoolDatabase *)local_118,&local_250,
                         (FileDescriptorProto *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_228,&local_229,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_288,(internal *)local_228,
               (AssertionResult *)"db.FindFileByName(\"foo.proto\", &file)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x250,pcVar2);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    testing::Message::~Message(&local_260);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    EqualsProto<char_const*>(local_2b0,"location { leading_detached_comments: \"comment\" }");
    testing::internal::
    MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
              ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffffb90._M_head_impl);
    FileDescriptorProto::source_code_info((FileDescriptorProto *)&gtest_ar_.message_);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
              (local_2a0,local_2a8,(SourceCodeInfo *)"file.source_code_info()");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar1) {
      testing::Message::Message(&local_2b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x253,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_2b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_2b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"foo.Foo",&local_2f9);
    local_2d1 = DescriptorPoolDatabase::FindFileContainingExtension
                          ((DescriptorPoolDatabase *)local_118,&local_2f8,3,
                           (FileDescriptorProto *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
    if (!bVar1) {
      testing::Message::Message(&local_308);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_2d0,
                 (AssertionResult *)"db.FindFileContainingExtension(\"foo.Foo\", 3, &file)","false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_310,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x255,pcVar2);
      testing::internal::AssertHelper::operator=(&local_310,&local_308);
      testing::internal::AssertHelper::~AssertHelper(&local_310);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_308);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      EqualsProto<char_const*>(local_350,"location { leading_detached_comments: \"comment\" }");
      testing::internal::
      MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
                ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffffb90._M_head_impl);
      FileDescriptorProto::source_code_info((FileDescriptorProto *)&gtest_ar_.message_);
      testing::internal::
      PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
                (local_340,local_348,(SourceCodeInfo *)"file.source_code_info()");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
      if (!bVar1) {
        testing::Message::Message(&local_358);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                   ,600,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_358)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_358);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"foo.Foo",&local_399);
      local_371 = DescriptorPoolDatabase::FindFileContainingSymbol
                            ((DescriptorPoolDatabase *)local_118,&local_398,
                             (FileDescriptorProto *)&gtest_ar_.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_370,&local_371,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator(&local_399);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
      if (!bVar1) {
        testing::Message::Message(&local_3a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_370,
                   (AssertionResult *)"db.FindFileContainingSymbol(\"foo.Foo\", &file)","false",
                   "true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_3b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                   ,0x25a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
        testing::internal::AssertHelper::~AssertHelper(&local_3b0);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_3a8);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        EqualsProto<char_const*>(local_3f0,"location { leading_detached_comments: \"comment\" }");
        testing::internal::
        MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
                  ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffffb90._M_head_impl);
        FileDescriptorProto::source_code_info((FileDescriptorProto *)&gtest_ar_.message_);
        testing::internal::
        PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::
        operator()(local_3e0,local_3e8,(SourceCodeInfo *)"file.source_code_info()");
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
        if (!bVar1) {
          testing::Message::Message(&local_3f8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_400,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                     ,0x25d,pcVar2);
          testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
          testing::internal::AssertHelper::~AssertHelper(&local_400);
          testing::Message::~Message(&local_3f8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  DescriptorPoolDatabase::~DescriptorPoolDatabase((DescriptorPoolDatabase *)local_118);
  DescriptorPool::~DescriptorPool((DescriptorPool *)&db.options_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase((SimpleDescriptorDatabase *)local_78);
  return;
}

Assistant:

TEST(DescriptorPoolDatabaseTest, PreserveSourceCodeInfo) {
  SimpleDescriptorDatabase original_db;
  AddToDatabase(&original_db, R"pb(
    name: "foo.proto"
    package: "foo"
    message_type {
      name: "Foo"
      extension_range { start: 1 end: 100 }
    }
    extension {
      name: "foo_ext"
      extendee: ".foo.Foo"
      number: 3
      label: LABEL_OPTIONAL
      type: TYPE_INT32
    }
    source_code_info { location { leading_detached_comments: "comment" } }
  )pb");
  DescriptorPool pool(&original_db);
  DescriptorPoolDatabase db(
      pool, DescriptorPoolDatabaseOptions{/*preserve_source_code_info=*/true});

  FileDescriptorProto file;
  ASSERT_TRUE(db.FindFileByName("foo.proto", &file));
  EXPECT_THAT(
      file.source_code_info(),
      EqualsProto(R"pb(location { leading_detached_comments: "comment" })pb"));

  ASSERT_TRUE(db.FindFileContainingExtension("foo.Foo", 3, &file));
  EXPECT_THAT(
      file.source_code_info(),
      EqualsProto(R"pb(location { leading_detached_comments: "comment" })pb"));

  ASSERT_TRUE(db.FindFileContainingSymbol("foo.Foo", &file));
  EXPECT_THAT(
      file.source_code_info(),
      EqualsProto(R"pb(location { leading_detached_comments: "comment" })pb"));
}